

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

void __thiscall jpgd::jpeg_decoder::H2V1Convert(jpeg_decoder *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  uint8 *puVar7;
  int iVar8;
  uint8 *puVar9;
  uint8 *puVar10;
  uint8 *puVar11;
  int j;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint8 *puVar16;
  int iVar17;
  
  if (0 < this->m_max_mcus_per_row) {
    lVar6 = (long)this->m_max_mcu_y_size - (long)this->m_mcu_lines_left;
    puVar9 = this->m_pSample_buf + lVar6 * 8 + 0x80;
    puVar11 = this->m_pSample_buf + lVar6 * 8;
    puVar7 = this->m_pScan_line_0;
    iVar3 = this->m_max_mcus_per_row;
    do {
      bVar2 = true;
      do {
        bVar4 = bVar2;
        puVar16 = puVar11;
        puVar10 = puVar9;
        lVar6 = 0;
        puVar11 = puVar7;
        do {
          puVar9 = puVar11;
          iVar17 = this->m_crr[puVar10[lVar6 + 0x40]];
          uVar13 = (uint)puVar16[lVar6 * 2];
          iVar14 = iVar17 + uVar13;
          iVar8 = 0;
          if (iVar14 < 1) {
            iVar14 = iVar8;
          }
          if (0xfe < iVar14) {
            iVar14 = 0xff;
          }
          iVar12 = this->m_cbg[puVar10[lVar6]] + this->m_crg[puVar10[lVar6 + 0x40]] >> 0x10;
          iVar15 = this->m_cbb[puVar10[lVar6]];
          puVar7[lVar6 * 8] = (uint8)iVar14;
          iVar14 = iVar12 + uVar13;
          if (iVar14 < 1) {
            iVar14 = 0;
          }
          if (0xfe < iVar14) {
            iVar14 = 0xff;
          }
          puVar7[lVar6 * 8 + 1] = (uint8)iVar14;
          iVar14 = uVar13 + iVar15;
          if (iVar14 < 1) {
            iVar14 = iVar8;
          }
          if (0xfe < iVar14) {
            iVar14 = 0xff;
          }
          puVar7[lVar6 * 8 + 2] = (uint8)iVar14;
          puVar7[lVar6 * 8 + 3] = 0xff;
          bVar1 = puVar16[lVar6 * 2 + 1];
          iVar17 = iVar17 + (uint)bVar1;
          if (iVar17 < 1) {
            iVar17 = iVar8;
          }
          if (0xfe < iVar17) {
            iVar17 = 0xff;
          }
          puVar7[lVar6 * 8 + 4] = (uint8)iVar17;
          iVar12 = iVar12 + (uint)bVar1;
          if (iVar12 < 1) {
            iVar12 = 0;
          }
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          puVar7[lVar6 * 8 + 5] = (uint8)iVar12;
          iVar15 = iVar15 + (uint)bVar1;
          if (0 < iVar15) {
            iVar8 = iVar15;
          }
          if (0xfe < iVar8) {
            iVar8 = 0xff;
          }
          lVar5 = lVar6 * 8;
          puVar7[lVar6 * 8 + 6] = (uint8)iVar8;
          puVar7[lVar6 * 8 + 7] = 0xff;
          lVar6 = lVar6 + 1;
          puVar11 = puVar7 + lVar5 + 8;
        } while (lVar6 != 4);
        puVar7 = puVar9 + 8;
        puVar9 = puVar10 + 4;
        puVar11 = puVar16 + 0x40;
        bVar2 = false;
      } while (bVar4);
      puVar11 = puVar16 + 0xc0;
      puVar9 = puVar10 + 0xfc;
      bVar2 = 1 < iVar3;
      iVar3 = iVar3 + -1;
    } while (bVar2);
  }
  return;
}

Assistant:

void jpeg_decoder::H2V1Convert()
	{
		int row = m_max_mcu_y_size - m_mcu_lines_left;
		uint8* d0 = m_pScan_line_0;
		uint8* y = m_pSample_buf + row * 8;
		uint8* c = m_pSample_buf + 2 * 64 + row * 8;

		for (int i = m_max_mcus_per_row; i > 0; i--)
		{
			for (int l = 0; l < 2; l++)
			{
				for (int j = 0; j < 4; j++)
				{
					int cb = c[0];
					int cr = c[64];

					int rc = m_crr[cr];
					int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
					int bc = m_cbb[cb];

					int yy = y[j << 1];
					d0[0] = clamp(yy + rc);
					d0[1] = clamp(yy + gc);
					d0[2] = clamp(yy + bc);
					d0[3] = 255;

					yy = y[(j << 1) + 1];
					d0[4] = clamp(yy + rc);
					d0[5] = clamp(yy + gc);
					d0[6] = clamp(yy + bc);
					d0[7] = 255;

					d0 += 8;

					c++;
				}
				y += 64;
			}

			y += 64 * 4 - 64 * 2;
			c += 64 * 4 - 8;
		}
	}